

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansend.c
# Opt level: O0

int main(int argc,char **argv)

{
  uchar dlc;
  int iVar1;
  ssize_t sVar2;
  long in_RSI;
  int in_EDI;
  ifreq ifr;
  can_raw_vcid_options vcid_opts;
  sockaddr_can addr;
  int enable_canfx;
  int mtu;
  int required_mtu;
  int s;
  char local_68 [15];
  undefined1 local_59;
  uint local_58;
  cu_t *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  undefined4 local_3c;
  sockaddr local_38;
  undefined4 local_20;
  uint local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_4;
  
  local_4 = 0;
  local_20 = 1;
  local_3c = 2;
  if (in_EDI == 3) {
    local_10 = in_RSI;
    local_18 = parse_canframe(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    if (local_18 == 0) {
      fprintf(_stderr,"\nWrong CAN-frame format!\n\n");
      print_usage((char *)0x1012ad);
      local_4 = 1;
    }
    else {
      local_14 = socket(0x1d,3,1);
      if (local_14 < 0) {
        perror("socket");
        local_4 = 1;
      }
      else {
        strncpy(local_68,*(char **)(local_10 + 8),0xf);
        local_59 = 0;
        local_58 = if_nametoindex(local_68);
        if (local_58 == 0) {
          perror("if_nametoindex");
          local_4 = 1;
        }
        else {
          memset(&local_38,0,0x18);
          local_38.sa_family = 0x1d;
          local_38.sa_data[2] = (undefined1)local_58;
          local_38.sa_data[3] = local_58._1_1_;
          local_38.sa_data[4] = local_58._2_1_;
          local_38.sa_data[5] = local_58._3_1_;
          if (0x10 < local_18) {
            iVar1 = ioctl(local_14,0x8921,local_68);
            if (iVar1 < 0) {
              perror("SIOCGIFMTU");
              return 1;
            }
            local_1c = local_58;
            if ((local_58 == 0x48) && (iVar1 = setsockopt(local_14,0x65,5,&local_20,4), iVar1 != 0))
            {
              printf("error when enabling CAN FD support\n");
              return 1;
            }
            if (0x4b < (int)local_1c) {
              iVar1 = setsockopt(local_14,0x65,7,&local_20,4);
              if (iVar1 != 0) {
                printf("error when enabling CAN XL support\n");
                return 1;
              }
              iVar1 = setsockopt(local_14,0x65,8,&local_3c,4);
              if (iVar1 != 0) {
                printf("error when enabling CAN XL VCID pass through\n");
                return 1;
              }
            }
          }
          if (local_18 == 0x48) {
            dlc = can_fd_len2dlc(main::cu.fd.len);
            main::cu.fd.len = can_fd_dlc2len(dlc);
          }
          if (local_18 == 0x80c) {
            local_18 = main::cu.xl.len + 0xc;
          }
          setsockopt(local_14,0x65,1,(void *)0x0,0);
          iVar1 = bind(local_14,&local_38,0x18);
          if (iVar1 < 0) {
            perror("bind");
            local_4 = 1;
          }
          else {
            sVar2 = write(local_14,&main::cu,(long)local_18);
            if (sVar2 == local_18) {
              close(local_14);
              local_4 = 0;
            }
            else {
              perror("write");
              local_4 = 1;
            }
          }
        }
      }
    }
  }
  else {
    print_usage((char *)0x10125b);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
	int s; /* can raw socket */
	int required_mtu;
	int mtu;
	int enable_canfx = 1;
	struct sockaddr_can addr;
	struct can_raw_vcid_options vcid_opts = {
		.flags = CAN_RAW_XL_VCID_TX_PASS,
	};
	static cu_t cu;
	struct ifreq ifr;

	/* check command line options */
	if (argc != 3) {
		print_usage(argv[0]);
		return 1;
	}

	/* parse CAN frame */
	required_mtu = parse_canframe(argv[2], &cu);
	if (!required_mtu) {
		fprintf(stderr, "\nWrong CAN-frame format!\n\n");
		print_usage(argv[0]);
		return 1;
	}

	/* open socket */
	if ((s = socket(PF_CAN, SOCK_RAW, CAN_RAW)) < 0) {
		perror("socket");
		return 1;
	}

	strncpy(ifr.ifr_name, argv[1], IFNAMSIZ - 1);
	ifr.ifr_name[IFNAMSIZ - 1] = '\0';
	ifr.ifr_ifindex = if_nametoindex(ifr.ifr_name);
	if (!ifr.ifr_ifindex) {
		perror("if_nametoindex");
		return 1;
	}

	memset(&addr, 0, sizeof(addr));
	addr.can_family = AF_CAN;
	addr.can_ifindex = ifr.ifr_ifindex;

	if (required_mtu > (int)CAN_MTU) {
		/* check if the frame fits into the CAN netdevice */
		if (ioctl(s, SIOCGIFMTU, &ifr) < 0) {
			perror("SIOCGIFMTU");
			return 1;
		}
		mtu = ifr.ifr_mtu;

		if (mtu == (int)CANFD_MTU) {
			/* interface is ok - try to switch the socket into CAN FD mode */
			if (setsockopt(s, SOL_CAN_RAW, CAN_RAW_FD_FRAMES,
				       &enable_canfx, sizeof(enable_canfx))){
				printf("error when enabling CAN FD support\n");
				return 1;
			}
		}

		if (mtu >= (int)CANXL_MIN_MTU) {
			/* interface is ok - try to switch the socket into CAN XL mode */
			if (setsockopt(s, SOL_CAN_RAW, CAN_RAW_XL_FRAMES,
				       &enable_canfx, sizeof(enable_canfx))){
				printf("error when enabling CAN XL support\n");
				return 1;
			}
			/* try to enable the CAN XL VCID pass through mode */
			if (setsockopt(s, SOL_CAN_RAW, CAN_RAW_XL_VCID_OPTS,
				       &vcid_opts, sizeof(vcid_opts))) {
				printf("error when enabling CAN XL VCID pass through\n");
				return 1;
			}
		}
	}

	/* ensure discrete CAN FD length values 0..8, 12, 16, 20, 24, 32, 64 */
	if (required_mtu == CANFD_MTU)
		cu.fd.len = can_fd_dlc2len(can_fd_len2dlc(cu.fd.len));

	/* CAN XL frames need real frame length for sending */
	if (required_mtu == CANXL_MTU)
		required_mtu = CANXL_HDR_SIZE + cu.xl.len;

	/*
	 * disable default receive filter on this RAW socket This is
	 * obsolete as we do not read from the socket at all, but for
	 * this reason we can remove the receive list in the Kernel to
	 * save a little (really a very little!) CPU usage.
	 */
	setsockopt(s, SOL_CAN_RAW, CAN_RAW_FILTER, NULL, 0);

	if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
		perror("bind");
		return 1;
	}

	/* send frame */
	if (write(s, &cu, required_mtu) != required_mtu) {
		perror("write");
		return 1;
	}

	close(s);

	return 0;
}